

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O0

int initToken(CK_SLOT_ID slotID,char *label,char *soPIN,char *userPIN)

{
  CK_TOKEN_INFO tokenInfo_00;
  CK_SLOT_ID CVar1;
  int iVar2;
  size_t sVar3;
  CK_RV CVar4;
  long lVar5;
  char *in_RSI;
  undefined8 *puVar6;
  CK_SLOT_ID in_RDI;
  undefined8 *puVar7;
  byte bVar8;
  CK_SLOT_ID newSlotID;
  CK_TOKEN_INFO tokenInfo;
  CK_SESSION_HANDLE hSession;
  CK_RV rv;
  CK_UTF8CHAR paddedLabel [32];
  char user_pin_copy [256];
  char so_pin_copy [256];
  undefined8 auStackY_538 [27];
  CK_SESSION_HANDLE local_460;
  uchar *local_458;
  CK_C_InitPIN local_450;
  CK_SESSION_HANDLE local_448;
  uchar *local_440;
  CK_C_Login slotID_00;
  uchar *__s;
  uchar *__dest;
  CK_C_InitToken p_Var9;
  undefined1 in_stack_fffffffffffffc00 [176];
  CK_SLOT_ID local_330;
  CK_ULONG in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  CK_SESSION_HANDLE local_258;
  CK_RV local_250;
  uchar local_248 [288];
  uchar local_128 [272];
  char *local_18;
  CK_SLOT_ID local_10;
  int local_4;
  
  bVar8 = 0;
  if (in_RSI == (char *)0x0) {
    fprintf(_stderr,"ERROR: A label for the token must be supplied. Use --label <text>\n");
    local_4 = 1;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    sVar3 = strlen(in_RSI);
    if (sVar3 < 0x21) {
      iVar2 = getPW(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      if (iVar2 == 0) {
        iVar2 = getPW(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8)
        ;
        if (iVar2 == 0) {
          builtin_memcpy(local_248 + 0x10,"                ",0x10);
          builtin_memcpy(local_248,"                ",0x10);
          sVar3 = strlen(local_18);
          __dest = local_248;
          memcpy(__dest,local_18,sVar3);
          CVar1 = local_10;
          p_Var9 = p11->C_InitToken;
          __s = local_128;
          sVar3 = strlen((char *)__s);
          CVar4 = (*p_Var9)(CVar1,__s,sVar3,__dest);
          local_250 = CVar4;
          if (CVar4 == 0) {
            local_250 = (*p11->C_OpenSession)(local_10,6,(void *)0x0,(CK_NOTIFY)0x0,&local_258);
            if (local_250 == 0) {
              slotID_00 = p11->C_Login;
              local_448 = local_258;
              local_440 = local_128;
              sVar3 = strlen((char *)local_128);
              local_250 = (*slotID_00)(local_448,0,local_440,sVar3);
              if (local_250 == 0) {
                local_450 = p11->C_InitPIN;
                local_460 = local_258;
                local_458 = local_248 + 0x20;
                sVar3 = strlen((char *)(local_248 + 0x20));
                local_250 = (*local_450)(local_460,local_458,sVar3);
                if (local_250 == 0) {
                  local_250 = (*p11->C_GetTokenInfo)
                                        (local_10,(_CK_TOKEN_INFO *)&stack0xfffffffffffffcd8);
                  if (local_250 == 0) {
                    (*p11->C_Finalize)((void *)0x0);
                    local_250 = (*p11->C_Initialize)((void *)0x0);
                    if (local_250 == 0) {
                      memcpy(&stack0xfffffffffffffc00,&stack0xfffffffffffffcd8,0xd0);
                      puVar6 = (undefined8 *)&stack0xfffffffffffffc00;
                      puVar7 = auStackY_538;
                      for (lVar5 = 0x1a; lVar5 != 0; lVar5 = lVar5 + -1) {
                        *puVar7 = *puVar6;
                        puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
                        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
                      }
                      tokenInfo_00.label._8_8_ = __dest;
                      tokenInfo_00.label._0_8_ = __s;
                      tokenInfo_00.label._16_8_ = p_Var9;
                      tokenInfo_00.label[0x18] = (char)CVar4;
                      tokenInfo_00.label[0x19] = (char)(CVar4 >> 8);
                      tokenInfo_00.label[0x1a] = (char)(CVar4 >> 0x10);
                      tokenInfo_00.label[0x1b] = (char)(CVar4 >> 0x18);
                      tokenInfo_00.label[0x1c] = (char)(CVar4 >> 0x20);
                      tokenInfo_00.label[0x1d] = (char)(CVar4 >> 0x28);
                      tokenInfo_00.label[0x1e] = (char)(CVar4 >> 0x30);
                      tokenInfo_00.label[0x1f] = (char)(CVar4 >> 0x38);
                      tokenInfo_00.manufacturerID[0] = in_stack_fffffffffffffc00[0];
                      tokenInfo_00.manufacturerID[1] = in_stack_fffffffffffffc00[1];
                      tokenInfo_00.manufacturerID[2] = in_stack_fffffffffffffc00[2];
                      tokenInfo_00.manufacturerID[3] = in_stack_fffffffffffffc00[3];
                      tokenInfo_00.manufacturerID[4] = in_stack_fffffffffffffc00[4];
                      tokenInfo_00.manufacturerID[5] = in_stack_fffffffffffffc00[5];
                      tokenInfo_00.manufacturerID[6] = in_stack_fffffffffffffc00[6];
                      tokenInfo_00.manufacturerID[7] = in_stack_fffffffffffffc00[7];
                      tokenInfo_00.manufacturerID[8] = in_stack_fffffffffffffc00[8];
                      tokenInfo_00.manufacturerID[9] = in_stack_fffffffffffffc00[9];
                      tokenInfo_00.manufacturerID[10] = in_stack_fffffffffffffc00[10];
                      tokenInfo_00.manufacturerID[0xb] = in_stack_fffffffffffffc00[0xb];
                      tokenInfo_00.manufacturerID[0xc] = in_stack_fffffffffffffc00[0xc];
                      tokenInfo_00.manufacturerID[0xd] = in_stack_fffffffffffffc00[0xd];
                      tokenInfo_00.manufacturerID[0xe] = in_stack_fffffffffffffc00[0xe];
                      tokenInfo_00.manufacturerID[0xf] = in_stack_fffffffffffffc00[0xf];
                      tokenInfo_00.manufacturerID[0x10] = in_stack_fffffffffffffc00[0x10];
                      tokenInfo_00.manufacturerID[0x11] = in_stack_fffffffffffffc00[0x11];
                      tokenInfo_00.manufacturerID[0x12] = in_stack_fffffffffffffc00[0x12];
                      tokenInfo_00.manufacturerID[0x13] = in_stack_fffffffffffffc00[0x13];
                      tokenInfo_00.manufacturerID[0x14] = in_stack_fffffffffffffc00[0x14];
                      tokenInfo_00.manufacturerID[0x15] = in_stack_fffffffffffffc00[0x15];
                      tokenInfo_00.manufacturerID[0x16] = in_stack_fffffffffffffc00[0x16];
                      tokenInfo_00.manufacturerID[0x17] = in_stack_fffffffffffffc00[0x17];
                      tokenInfo_00.manufacturerID[0x18] = in_stack_fffffffffffffc00[0x18];
                      tokenInfo_00.manufacturerID[0x19] = in_stack_fffffffffffffc00[0x19];
                      tokenInfo_00.manufacturerID[0x1a] = in_stack_fffffffffffffc00[0x1a];
                      tokenInfo_00.manufacturerID[0x1b] = in_stack_fffffffffffffc00[0x1b];
                      tokenInfo_00.manufacturerID[0x1c] = in_stack_fffffffffffffc00[0x1c];
                      tokenInfo_00.manufacturerID[0x1d] = in_stack_fffffffffffffc00[0x1d];
                      tokenInfo_00.manufacturerID[0x1e] = in_stack_fffffffffffffc00[0x1e];
                      tokenInfo_00.manufacturerID[0x1f] = in_stack_fffffffffffffc00[0x1f];
                      tokenInfo_00.model[0] = in_stack_fffffffffffffc00[0x20];
                      tokenInfo_00.model[1] = in_stack_fffffffffffffc00[0x21];
                      tokenInfo_00.model[2] = in_stack_fffffffffffffc00[0x22];
                      tokenInfo_00.model[3] = in_stack_fffffffffffffc00[0x23];
                      tokenInfo_00.model[4] = in_stack_fffffffffffffc00[0x24];
                      tokenInfo_00.model[5] = in_stack_fffffffffffffc00[0x25];
                      tokenInfo_00.model[6] = in_stack_fffffffffffffc00[0x26];
                      tokenInfo_00.model[7] = in_stack_fffffffffffffc00[0x27];
                      tokenInfo_00.model[8] = in_stack_fffffffffffffc00[0x28];
                      tokenInfo_00.model[9] = in_stack_fffffffffffffc00[0x29];
                      tokenInfo_00.model[10] = in_stack_fffffffffffffc00[0x2a];
                      tokenInfo_00.model[0xb] = in_stack_fffffffffffffc00[0x2b];
                      tokenInfo_00.model[0xc] = in_stack_fffffffffffffc00[0x2c];
                      tokenInfo_00.model[0xd] = in_stack_fffffffffffffc00[0x2d];
                      tokenInfo_00.model[0xe] = in_stack_fffffffffffffc00[0x2e];
                      tokenInfo_00.model[0xf] = in_stack_fffffffffffffc00[0x2f];
                      tokenInfo_00.serialNumber[0] = in_stack_fffffffffffffc00[0x30];
                      tokenInfo_00.serialNumber[1] = in_stack_fffffffffffffc00[0x31];
                      tokenInfo_00.serialNumber[2] = in_stack_fffffffffffffc00[0x32];
                      tokenInfo_00.serialNumber[3] = in_stack_fffffffffffffc00[0x33];
                      tokenInfo_00.serialNumber[4] = in_stack_fffffffffffffc00[0x34];
                      tokenInfo_00.serialNumber[5] = in_stack_fffffffffffffc00[0x35];
                      tokenInfo_00.serialNumber[6] = in_stack_fffffffffffffc00[0x36];
                      tokenInfo_00.serialNumber[7] = in_stack_fffffffffffffc00[0x37];
                      tokenInfo_00.serialNumber[8] = in_stack_fffffffffffffc00[0x38];
                      tokenInfo_00.serialNumber[9] = in_stack_fffffffffffffc00[0x39];
                      tokenInfo_00.serialNumber[10] = in_stack_fffffffffffffc00[0x3a];
                      tokenInfo_00.serialNumber[0xb] = in_stack_fffffffffffffc00[0x3b];
                      tokenInfo_00.serialNumber[0xc] = in_stack_fffffffffffffc00[0x3c];
                      tokenInfo_00.serialNumber[0xd] = in_stack_fffffffffffffc00[0x3d];
                      tokenInfo_00.serialNumber[0xe] = in_stack_fffffffffffffc00[0x3e];
                      tokenInfo_00.serialNumber[0xf] = in_stack_fffffffffffffc00[0x3f];
                      tokenInfo_00.flags = in_stack_fffffffffffffc00._64_8_;
                      tokenInfo_00.ulMaxSessionCount = in_stack_fffffffffffffc00._72_8_;
                      tokenInfo_00.ulSessionCount = in_stack_fffffffffffffc00._80_8_;
                      tokenInfo_00.ulMaxRwSessionCount = in_stack_fffffffffffffc00._88_8_;
                      tokenInfo_00.ulRwSessionCount = in_stack_fffffffffffffc00._96_8_;
                      tokenInfo_00.ulMaxPinLen = in_stack_fffffffffffffc00._104_8_;
                      tokenInfo_00.ulMinPinLen = in_stack_fffffffffffffc00._112_8_;
                      tokenInfo_00.ulTotalPublicMemory = in_stack_fffffffffffffc00._120_8_;
                      tokenInfo_00.ulFreePublicMemory = in_stack_fffffffffffffc00._128_8_;
                      tokenInfo_00.ulTotalPrivateMemory = in_stack_fffffffffffffc00._136_8_;
                      tokenInfo_00.ulFreePrivateMemory = in_stack_fffffffffffffc00._144_8_;
                      tokenInfo_00.hardwareVersion.major = (char)in_stack_fffffffffffffc00._152_2_;
                      tokenInfo_00.hardwareVersion.minor =
                           (char)((ushort)in_stack_fffffffffffffc00._152_2_ >> 8);
                      tokenInfo_00.firmwareVersion.major = (char)in_stack_fffffffffffffc00._154_2_;
                      tokenInfo_00.firmwareVersion.minor =
                           (char)((ushort)in_stack_fffffffffffffc00._154_2_ >> 8);
                      tokenInfo_00.utcTime[0] = in_stack_fffffffffffffc00[0x9c];
                      tokenInfo_00.utcTime[1] = in_stack_fffffffffffffc00[0x9d];
                      tokenInfo_00.utcTime[2] = in_stack_fffffffffffffc00[0x9e];
                      tokenInfo_00.utcTime[3] = in_stack_fffffffffffffc00[0x9f];
                      tokenInfo_00.utcTime[4] = in_stack_fffffffffffffc00[0xa0];
                      tokenInfo_00.utcTime[5] = in_stack_fffffffffffffc00[0xa1];
                      tokenInfo_00.utcTime[6] = in_stack_fffffffffffffc00[0xa2];
                      tokenInfo_00.utcTime[7] = in_stack_fffffffffffffc00[0xa3];
                      tokenInfo_00.utcTime[8] = in_stack_fffffffffffffc00[0xa4];
                      tokenInfo_00.utcTime[9] = in_stack_fffffffffffffc00[0xa5];
                      tokenInfo_00.utcTime[10] = in_stack_fffffffffffffc00[0xa6];
                      tokenInfo_00.utcTime[0xb] = in_stack_fffffffffffffc00[0xa7];
                      tokenInfo_00.utcTime[0xc] = in_stack_fffffffffffffc00[0xa8];
                      tokenInfo_00.utcTime[0xd] = in_stack_fffffffffffffc00[0xa9];
                      tokenInfo_00.utcTime[0xe] = in_stack_fffffffffffffc00[0xaa];
                      tokenInfo_00.utcTime[0xf] = in_stack_fffffffffffffc00[0xab];
                      tokenInfo_00._204_4_ = in_stack_fffffffffffffc00._172_4_;
                      iVar2 = findSlot(tokenInfo_00,(CK_SLOT_ID *)slotID_00);
                      if (iVar2 == 0) {
                        if (local_10 == local_330) {
                          printf("The token has been initialized on slot %lu\n",local_330);
                        }
                        else {
                          printf("The token has been initialized and is reassigned to slot %lu\n",
                                 local_330);
                        }
                        local_4 = 0;
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      fprintf(_stderr,"ERROR: Could not initialize the library.\n");
                      local_4 = 1;
                    }
                  }
                  else {
                    fprintf(_stderr,
                            "ERROR: Could not get info about the initialized token in slot %lu.\n",
                            local_10);
                    local_4 = 1;
                  }
                }
                else {
                  fprintf(_stderr,"ERROR: Could not initialize the user PIN.\n");
                  local_4 = 1;
                }
              }
              else {
                fprintf(_stderr,"ERROR: Could not log in on the token.\n");
                local_4 = 1;
              }
            }
            else {
              fprintf(_stderr,"ERROR: Could not open a session with the library.\n");
              local_4 = 1;
            }
          }
          else if (CVar4 == 3) {
            fprintf(_stderr,"CKR_SLOT_ID_INVALID: Slot %lu does not exist.\n",local_10);
            local_4 = 1;
          }
          else if (CVar4 == 0xa0) {
            fprintf(_stderr,
                    "CKR_PIN_INCORRECT: The given SO PIN does not match the one in the token. Needed when reinitializing the token.\n"
                   );
            local_4 = 1;
          }
          else if (CVar4 == 0xe0) {
            fprintf(_stderr,
                    "CKR_TOKEN_NOT_PRESENT: The token is not present. Please read the HSM manual for further assistance.\n"
                   );
            local_4 = 1;
          }
          else {
            fprintf(_stderr,"ERROR rv=0x%08X: Could not initialize the token.\n",CVar4 & 0xffffffff)
            ;
            fprintf(_stderr,"Please check log files for additional information.\n");
            local_4 = 1;
          }
        }
        else {
          fprintf(_stderr,"ERROR: Could not get user PIN\n");
          local_4 = 1;
        }
      }
      else {
        fprintf(_stderr,"ERROR: Could not get SO PIN\n");
        local_4 = 1;
      }
    }
    else {
      fprintf(_stderr,"ERROR: The token label must not have a length greater than 32 chars.\n");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int initToken(CK_SLOT_ID slotID, char* label, char* soPIN, char* userPIN)
{
	char so_pin_copy[MAX_PIN_LEN+1];
	char user_pin_copy[MAX_PIN_LEN+1];

	if (label == NULL)
	{
		fprintf(stderr, "ERROR: A label for the token must be supplied. "
				"Use --label <text>\n");
		return 1;
	}

	if (strlen(label) > 32)
	{
		fprintf(stderr, "ERROR: The token label must not have a length "
				"greater than 32 chars.\n");
		return 1;
	}

	// Get the passwords
	if (getPW(soPIN, so_pin_copy, CKU_SO) != 0)
	{
		fprintf(stderr, "ERROR: Could not get SO PIN\n");
		return 1;
	}
	if (getPW(userPIN, user_pin_copy, CKU_USER) != 0)
	{
		fprintf(stderr, "ERROR: Could not get user PIN\n");
		return 1;
	}

	// Load the variables
	CK_UTF8CHAR paddedLabel[32];
	memset(paddedLabel, ' ', sizeof(paddedLabel));
	memcpy(paddedLabel, label, strlen(label));

	CK_RV rv = p11->C_InitToken(slotID, (CK_UTF8CHAR_PTR)so_pin_copy, strlen(so_pin_copy), paddedLabel);

	switch (rv)
	{
		case CKR_OK:
			break;
		case CKR_SLOT_ID_INVALID:
			fprintf(stderr, "CKR_SLOT_ID_INVALID: Slot %lu does not exist.\n", slotID);
			return 1;
			break;
		case CKR_PIN_INCORRECT:
			fprintf(stderr, "CKR_PIN_INCORRECT: The given SO PIN does not match the "
					"one in the token. Needed when reinitializing the token.\n");
			return 1;
			break;
		case CKR_TOKEN_NOT_PRESENT:
			fprintf(stderr, "CKR_TOKEN_NOT_PRESENT: The token is not present. "
					"Please read the HSM manual for further assistance.\n");
			return 1;
			break;
		default:
			fprintf(stderr, "ERROR rv=0x%08X: Could not initialize the token.\n", (unsigned int)rv);
			fprintf(stderr, "Please check log files for additional information.\n");
			return 1;
			break;
	}

	CK_SESSION_HANDLE hSession;
	rv = p11->C_OpenSession(slotID, CKF_SERIAL_SESSION | CKF_RW_SESSION, NULL_PTR, NULL_PTR, &hSession);
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not open a session with the library.\n");
		return 1;
	}

	rv = p11->C_Login(hSession, CKU_SO, (CK_UTF8CHAR_PTR)so_pin_copy, strlen(so_pin_copy));
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not log in on the token.\n");
		return 1;
	}

	rv = p11->C_InitPIN(hSession, (CK_UTF8CHAR_PTR)user_pin_copy, strlen(user_pin_copy));
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not initialize the user PIN.\n");
		return 1;
	}

	// Get the token info
	CK_TOKEN_INFO tokenInfo;
	rv = p11->C_GetTokenInfo(slotID, &tokenInfo);
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not get info about the initialized token in slot %lu.\n", slotID);
		return 1;
	}

	// Reload the library
	p11->C_Finalize(NULL_PTR);
	rv = p11->C_Initialize(NULL_PTR);
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not initialize the library.\n");
		return 1;
	}

	// Get the slotID
	CK_SLOT_ID newSlotID;
	if (findSlot(tokenInfo, newSlotID))
	{
		return 1;
	}

	if (slotID == newSlotID)
	{
		printf("The token has been initialized on slot %lu\n", newSlotID);
	}
	else
	{
		printf("The token has been initialized and is reassigned to slot %lu\n", newSlotID);
	}

	return 0;
}